

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O2

void duckdb::alp::AlpCompression<float,_false>::FindBestFactorAndExponent
               (float *input_vector,idx_t n_values,State *state)

{
  pointer pAVar1;
  double dVar2;
  uint64_t uVar3;
  ulong uVar4;
  ushort uVar5;
  ulong uVar6;
  AlpEncodingIndices AVar7;
  long lVar8;
  AlpCombination *combination;
  pointer pAVar9;
  undefined1 auVar10 [16];
  vector<float,_true> vector_sample;
  
  vector_sample.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  auVar10._8_4_ = (int)(n_values >> 0x20);
  auVar10._0_8_ = n_values;
  auVar10._12_4_ = 0x45300000;
  vector_sample.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vector_sample.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  dVar2 = ceil(((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)n_values) - 4503599627370496.0)) * 0.03125);
  uVar4 = 1;
  if (1 < (uint)(long)dVar2) {
    uVar4 = (long)dVar2;
  }
  for (uVar6 = 0; uVar6 < n_values; uVar6 = uVar6 + (uVar4 & 0xffffffff)) {
    ::std::vector<float,_std::allocator<float>_>::push_back
              (&vector_sample.super_vector<float,_std::allocator<float>_>,input_vector);
    input_vector = input_vector + (uVar4 & 0xffffffff);
  }
  pAVar1 = (state->best_k_combinations).
           super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
           super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = 0xffffffffffffffff;
  AVar7.exponent = '\0';
  AVar7.factor = '\0';
  uVar5 = 0;
  lVar8 = 0;
  for (pAVar9 = (state->best_k_combinations).
                super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                .
                super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
                ._M_impl.super__Vector_impl_data._M_start; pAVar9 != pAVar1; pAVar9 = pAVar9 + 1) {
    uVar3 = DryCompressToEstimateSize<false>(&vector_sample,SUB42(*(undefined4 *)pAVar9,0));
    if (uVar3 < uVar4) {
      AVar7 = pAVar9->encoding_indices;
      uVar5 = (ushort)AVar7 >> 8;
      lVar8 = 0;
      uVar4 = uVar3;
    }
    else {
      lVar8 = lVar8 + 1;
      if (lVar8 == 2) break;
    }
  }
  state->vector_encoding_indices = (AlpEncodingIndices)((ushort)AVar7 & 0xff | uVar5 << 8);
  ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&vector_sample);
  return;
}

Assistant:

static void FindBestFactorAndExponent(const T *input_vector, idx_t n_values, State &state) {
		//! We sample equidistant values within a vector; to do this we skip a fixed number of values
		vector<T> vector_sample;
		auto idx_increments = MaxValue<uint32_t>(
		    1, ExactNumericCast<uint32_t>(std::ceil((double)n_values / AlpConstants::SAMPLES_PER_VECTOR)));
		for (idx_t i = 0; i < n_values; i += idx_increments) {
			vector_sample.push_back(input_vector[i]);
		}

		AlpEncodingIndices best_encoding_indices = {0, 0};
		uint64_t best_total_bits = NumericLimits<uint64_t>::Maximum();
		idx_t worse_total_bits_counter = 0;

		//! We try each K combination in search for the one which minimize the compression size in the vector
		for (auto &combination : state.best_k_combinations) {
			uint64_t estimated_compression_size =
			    DryCompressToEstimateSize<false>(vector_sample, combination.encoding_indices);

			// If current compression size is worse (higher) or equal than the current best combination
			if (estimated_compression_size >= best_total_bits) {
				worse_total_bits_counter += 1;
				// Early exit strategy
				if (worse_total_bits_counter == AlpConstants::SAMPLING_EARLY_EXIT_THRESHOLD) {
					break;
				}
				continue;
			}
			// Otherwise we replace the best and continue trying with the next combination
			best_total_bits = estimated_compression_size;
			best_encoding_indices = combination.encoding_indices;
			worse_total_bits_counter = 0;
		}
		state.vector_encoding_indices = best_encoding_indices;
	}